

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,StringPiece name)

{
  pthread_mutex_t *__mutex;
  DescriptorPool *pool_00;
  Symbol SVar1;
  WrappedMutex *mu;
  Symbol unaff_R13;
  bool bVar2;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  
  __mutex = (pthread_mutex_t *)pool->mutex_;
  if (__mutex == (pthread_mutex_t *)0x0) {
    mu = (Mutex *)0x0;
  }
  else {
    std::mutex::lock((mutex *)&__mutex->__data);
    bVar2 = true;
    if ((this->known_bad_files_)._M_h._M_element_count == 0 &&
        (this->known_bad_symbols_)._M_h._M_element_count == 0) {
      unaff_R13 = FindSymbol(this,name);
      if (unaff_R13.ptr_ == (SymbolBase *)0x0) {
        unaff_R13.ptr_ = (SymbolBase *)0x0;
      }
      else {
        bVar2 = (unaff_R13.ptr_)->symbol_type_ == '\0';
      }
    }
    pthread_mutex_unlock(__mutex);
    if (!bVar2) {
      return (Symbol)unaff_R13.ptr_;
    }
    mu = pool->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_38,mu);
  if (pool->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(this->known_bad_files_)._M_h);
  }
  SVar1 = FindSymbol(this,name);
  if ((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ == '\0')) {
    pool_00 = pool->underlay_;
    if (pool_00 != (DescriptorPool *)0x0) {
      SVar1 = FindByNameHelper((pool_00->tables_)._M_t.
                               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                               .
                               super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                               ._M_head_impl,pool_00,name);
    }
    if (((SVar1.ptr_ == (SymbolBase *)0x0) || ((SVar1.ptr_)->symbol_type_ == '\0')) &&
       (bVar2 = TryFindSymbolInFallbackDatabase(pool,name), bVar2)) {
      SVar1 = FindSymbol(this,name);
    }
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(const DescriptorPool* pool,
                                                StringPiece name) {
  if (pool->mutex_ != nullptr) {
    // Fast path: the Symbol is already cached.  This is just a hash lookup.
    ReaderMutexLock lock(pool->mutex_);
    if (known_bad_symbols_.empty() && known_bad_files_.empty()) {
      Symbol result = FindSymbol(name);
      if (!result.IsNull()) return result;
    }
  }
  MutexLockMaybe lock(pool->mutex_);
  if (pool->fallback_database_ != nullptr) {
    known_bad_symbols_.clear();
    known_bad_files_.clear();
  }
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != nullptr) {
    // Symbol not found; check the underlay.
    result = pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}